

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O2

int run_test_random_async(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_a0;
  uv_random_t req;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_random(puVar2,&req,scratch,0x100,0xffffffff,random_cb);
  if (iVar1 == -0x16) {
    iVar1 = uv_random(puVar2,&req,scratch,0xffffffffffffffff,0xffffffff,random_cb);
    if (iVar1 == -7) {
      iVar1 = uv_random(puVar2,&req,scratch,0,0,random_cb);
      if (iVar1 == 0) {
        if (random_cb_called == 0) {
          iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
          if (iVar1 == 0) {
            if (random_cb_called == 1) {
              iVar1 = uv_random(puVar2,&req,scratch,0x100,0,random_cb);
              if (iVar1 == 0) {
                if (random_cb_called == 1) {
                  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                  if (iVar1 == 0) {
                    if (random_cb_called == 2) {
                      puVar2 = uv_default_loop();
                      close_loop(puVar2);
                      puVar2 = uv_default_loop();
                      iVar1 = uv_loop_close(puVar2);
                      if (iVar1 == 0) {
                        return 0;
                      }
                      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                      uStack_a0 = 0x49;
                    }
                    else {
                      pcVar3 = "2 == random_cb_called";
                      uStack_a0 = 0x47;
                    }
                  }
                  else {
                    pcVar3 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                    uStack_a0 = 0x46;
                  }
                }
                else {
                  pcVar3 = "1 == random_cb_called";
                  uStack_a0 = 0x44;
                }
              }
              else {
                pcVar3 = "0 == uv_random(loop, &req, scratch, sizeof(scratch), 0, random_cb)";
                uStack_a0 = 0x43;
              }
            }
            else {
              pcVar3 = "1 == random_cb_called";
              uStack_a0 = 0x41;
            }
          }
          else {
            pcVar3 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
            uStack_a0 = 0x40;
          }
        }
        else {
          pcVar3 = "0 == random_cb_called";
          uStack_a0 = 0x3e;
        }
      }
      else {
        pcVar3 = "0 == uv_random(loop, &req, scratch, 0, 0, random_cb)";
        uStack_a0 = 0x3d;
      }
    }
    else {
      pcVar3 = "UV_E2BIG == uv_random(loop, &req, scratch, -1, -1, random_cb)";
      uStack_a0 = 0x3b;
    }
  }
  else {
    pcVar3 = "UV_EINVAL == uv_random(loop, &req, scratch, sizeof(scratch), -1, random_cb)";
    uStack_a0 = 0x3a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
          ,uStack_a0,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(random_async) {
  uv_random_t req;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT(UV_EINVAL == uv_random(loop, &req, scratch, sizeof(scratch), -1,
                                random_cb));
  ASSERT(UV_E2BIG == uv_random(loop, &req, scratch, -1, -1, random_cb));

  ASSERT(0 == uv_random(loop, &req, scratch, 0, 0, random_cb));
  ASSERT(0 == random_cb_called);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == random_cb_called);

  ASSERT(0 == uv_random(loop, &req, scratch, sizeof(scratch), 0, random_cb));
  ASSERT(1 == random_cb_called);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(2 == random_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}